

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void fts5IterClose(Fts5IndexIter *pIndexIter)

{
  u8 *puVar1;
  sqlite3_blob *pBlob;
  int iVar2;
  Fts5Iter *pIter;
  
  if (pIndexIter != (Fts5IndexIter *)0x0) {
    puVar1 = pIndexIter[1].pData;
    fts5TokendataIterDelete((Fts5TokenDataIter *)pIndexIter[1].iRowid);
    fts5MultiIterFree((Fts5Iter *)pIndexIter);
    pBlob = *(sqlite3_blob **)(puVar1 + 0x48);
    if (pBlob != (sqlite3_blob *)0x0) {
      puVar1[0x48] = '\0';
      puVar1[0x49] = '\0';
      puVar1[0x4a] = '\0';
      puVar1[0x4b] = '\0';
      puVar1[0x4c] = '\0';
      puVar1[0x4d] = '\0';
      puVar1[0x4e] = '\0';
      puVar1[0x4f] = '\0';
      iVar2 = sqlite3_blob_close(pBlob);
      if (*(int *)(puVar1 + 0x3c) == 0) {
        *(int *)(puVar1 + 0x3c) = iVar2;
      }
    }
  }
  return;
}

Assistant:

static void fts5IterClose(Fts5IndexIter *pIndexIter){
  if( pIndexIter ){
    Fts5Iter *pIter = (Fts5Iter*)pIndexIter;
    Fts5Index *pIndex = pIter->pIndex;
    fts5TokendataIterDelete(pIter->pTokenDataIter);
    fts5MultiIterFree(pIter);
    fts5IndexCloseReader(pIndex);
  }
}